

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O0

CMDPSTATE * __thiscall
ADPlanner::GetState(ADPlanner *this,int stateID,ADSearchStateSpace_t *pSearchStateSpace)

{
  size_type sVar1;
  SBPL_Exception *this_00;
  reference ppiVar2;
  reference ppCVar3;
  vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *this_01;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  char *in_stack_ffffffffffffffb8;
  value_type local_8;
  
  sVar1 = std::vector<int_*,_std::allocator<int_*>_>::size
                    ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8));
  if ((int)sVar1 <= in_ESI) {
    this_00 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(this_00,in_stack_ffffffffffffffb8);
    __cxa_throw(this_00,&SBPL_Exception::typeinfo,SBPL_Exception::~SBPL_Exception);
  }
  ppiVar2 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                      ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8),(long)in_ESI);
  if (**ppiVar2 == -1) {
    local_8 = (value_type)(**(code **)(*in_RDI + 0xc0))(in_RDI,in_ESI,in_RDX);
  }
  else {
    this_01 = (vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_> *)(in_RDX + 0x38);
    ppiVar2 = std::vector<int_*,_std::allocator<int_*>_>::operator[]
                        ((vector<int_*,_std::allocator<int_*>_> *)(in_RDI[1] + 8),(long)in_ESI);
    ppCVar3 = std::vector<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>::operator[]
                        (this_01,(long)**ppiVar2);
    local_8 = *ppCVar3;
  }
  return local_8;
}

Assistant:

CMDPSTATE* ADPlanner::GetState(int stateID, ADSearchStateSpace_t* pSearchStateSpace)
{
    if (stateID >= (int)environment_->StateID2IndexMapping.size()) {
        throw SBPL_Exception("ERROR in GetState: stateID is invalid");
    }

    if (environment_->StateID2IndexMapping[stateID][ADMDP_STATEID2IND] == -1)
        return CreateState(stateID, pSearchStateSpace);
    else
        return pSearchStateSpace->searchMDP.StateArray[environment_->StateID2IndexMapping[stateID][ADMDP_STATEID2IND]];
}